

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

string * testing::internal::FormatDeathTestOutput(string *__return_storage_ptr__,string *output)

{
  pointer pcVar1;
  void *pvVar2;
  size_t __n;
  ulong __pos;
  ulong uVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __pos = 0;
  do {
    uVar4 = 0xffffffffffffffff;
    __n = output->_M_string_length - __pos;
    if (__pos <= output->_M_string_length && __n != 0) {
      pcVar1 = (output->_M_dataplus)._M_p;
      pvVar2 = memchr(pcVar1 + __pos,10,__n);
      uVar4 = -(ulong)(pvVar2 == (void *)0x0) | (long)pvVar2 - (long)pcVar1;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"[  DEATH   ] ");
    if (uVar4 == 0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_50,output,__pos,0xffffffffffffffff);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,local_50._M_dataplus._M_p,local_50._M_string_length);
      uVar3 = __pos;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      uVar3 = uVar4 + 1;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_50,output,__pos,uVar3 - __pos);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,local_50._M_dataplus._M_p,local_50._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    __pos = uVar3;
  } while (uVar4 != 0xffffffffffffffff);
  return __return_storage_ptr__;
}

Assistant:

static ::std::string FormatDeathTestOutput(const ::std::string& output) {
  ::std::string ret;
  for (size_t at = 0; ; ) {
    const size_t line_end = output.find('\n', at);
    ret += "[  DEATH   ] ";
    if (line_end == ::std::string::npos) {
      ret += output.substr(at);
      break;
    }
    ret += output.substr(at, line_end + 1 - at);
    at = line_end + 1;
  }
  return ret;
}